

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_unshuffle_4bytes(char *heap,LONGLONG length,int *status)

{
  void *__src;
  char *local_40;
  char *heapptr;
  char *cptr;
  char *ptr;
  LONGLONG ii;
  int *status_local;
  LONGLONG length_local;
  char *heap_local;
  
  __src = malloc(length << 2);
  local_40 = heap + length * 4;
  heapptr = (char *)((long)__src + length * 4 + -1);
  for (ptr = (char *)0x0; local_40 = local_40 + -1, (long)ptr < length; ptr = ptr + 1) {
    *heapptr = *local_40;
    heapptr[-1] = local_40[-length];
    heapptr[-2] = local_40[length * -2];
    heapptr[-3] = local_40[length * -3];
    heapptr = heapptr + -4;
  }
  memcpy(heap,__src,length << 2);
  free(__src);
  return *status;
}

Assistant:

static int fits_unshuffle_4bytes(char *heap, LONGLONG length, int *status)

/* unshuffle the bytes in an array of 4-byte integers or floats */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = malloc((size_t) (length * 4));
    heapptr = heap + (4 * length) -1;
    cptr = ptr + (4 * length) -1;
 
    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       cptr--;
       *cptr = *(heapptr - length);
       cptr--;
       *cptr = *(heapptr - (2 * length));
       cptr--;
       *cptr = *(heapptr - (3 * length));
       cptr--;
       heapptr--;
    }
        
    memcpy(heap, ptr, (size_t) (length * 4));
    free(ptr);
    return(*status);
}